

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadedSocketAcceptor.cpp
# Opt level: O0

void __thiscall
FIX::ThreadedSocketAcceptor::removeThread(ThreadedSocketAcceptor *this,socket_handle s)

{
  bool bVar1;
  pointer ppVar2;
  _Self local_40 [3];
  _Self local_28;
  iterator i;
  Locker l;
  socket_handle s_local;
  ThreadedSocketAcceptor *this_local;
  
  l.m_mutex._4_4_ = s;
  Locker::Locker((Locker *)&i,&this->m_mutex);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
       ::find(&this->m_threads,(key_type *)((long)&l.m_mutex + 4));
  local_40[0]._M_node =
       (_Base_ptr)
       std::
       map<int,_unsigned_long,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_long>_>_>
       ::end(&this->m_threads);
  bVar1 = std::operator!=(&local_28,local_40);
  if (bVar1) {
    ppVar2 = std::_Rb_tree_iterator<std::pair<const_int,_unsigned_long>_>::operator->(&local_28);
    thread_detach(ppVar2->second);
    std::map<int,unsigned_long,std::less<int>,std::allocator<std::pair<int_const,unsigned_long>>>::
    erase_abi_cxx11_((map<int,unsigned_long,std::less<int>,std::allocator<std::pair<int_const,unsigned_long>>>
                      *)&this->m_threads,(iterator)local_28._M_node);
  }
  Locker::~Locker((Locker *)&i);
  return;
}

Assistant:

void ThreadedSocketAcceptor::removeThread(socket_handle s )
{
  Locker l(m_mutex);
  SocketToThread::iterator i = m_threads.find( s );
  if ( i != m_threads.end() )
  {
    thread_detach( i->second );
    m_threads.erase( i );
  }
}